

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

void length_encoder_reset(lzma_length_encoder *lencoder,uint32_t num_pos_states,_Bool fast_mode)

{
  probability (*papVar1) [8];
  uint32_t pos_state;
  uint32_t pos_state_00;
  probability (*papVar2) [8];
  ulong uVar3;
  uint32_t bt_i;
  long lVar4;
  
  lencoder->choice = 0x400;
  lencoder->choice2 = 0x400;
  if (num_pos_states != 0) {
    papVar1 = lencoder->low;
    papVar2 = lencoder->mid;
    uVar3 = 0;
    do {
      lVar4 = 0;
      do {
        (*papVar1)[lVar4] = 0x400;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      lVar4 = 0;
      do {
        (*papVar2)[lVar4] = 0x400;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar3 = uVar3 + 1;
      papVar1 = papVar1 + 1;
      papVar2 = papVar2 + 1;
    } while (uVar3 != num_pos_states);
  }
  lVar4 = 0x102;
  do {
    *(undefined2 *)((long)(lencoder->low + -1) + 0xc + lVar4 * 2) = 0x400;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x202);
  if (num_pos_states != 0 && !fast_mode) {
    pos_state_00 = 0;
    do {
      length_update_prices(lencoder,pos_state_00);
      pos_state_00 = pos_state_00 + 1;
    } while (num_pos_states != pos_state_00);
  }
  return;
}

Assistant:

static void
length_encoder_reset(lzma_length_encoder *lencoder,
		const uint32_t num_pos_states, const bool fast_mode)
{
	bit_reset(lencoder->choice);
	bit_reset(lencoder->choice2);

	for (size_t pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(lencoder->low[pos_state], LEN_LOW_BITS);
		bittree_reset(lencoder->mid[pos_state], LEN_MID_BITS);
	}

	bittree_reset(lencoder->high, LEN_HIGH_BITS);

	if (!fast_mode)
		for (uint32_t pos_state = 0; pos_state < num_pos_states;
				++pos_state)
			length_update_prices(lencoder, pos_state);

	return;
}